

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall flow::lang::LiteralExpr<bool>::LiteralExpr(LiteralExpr<bool> *this,bool *value)

{
  SourceLocation local_50;
  bool *local_18;
  bool *value_local;
  LiteralExpr<bool> *this_local;
  
  local_18 = value;
  value_local = (bool *)this;
  SourceLocation::SourceLocation(&local_50);
  LiteralExpr(this,value,&local_50);
  SourceLocation::~SourceLocation(&local_50);
  return;
}

Assistant:

explicit LiteralExpr(const T& value)
      : LiteralExpr(value, SourceLocation()) {}